

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void PreEvaluate(Situation *situation)

{
  undefined4 uVar1;
  undefined6 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  UINT8 *pUVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int i;
  long lVar14;
  bool bVar15;
  char cVar16;
  char cVar21;
  char cVar22;
  char cVar24;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar25;
  ulong uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  ulong uVar29;
  undefined1 auVar30 [16];
  int attackless_pawn_value [256];
  int attacking_pawn_value [256];
  int local_838 [256];
  int local_438 [258];
  undefined1 auVar18 [16];
  undefined2 uVar23;
  
  memset(local_438,0,0x400);
  memset(local_838,0,0x400);
  pUVar10 = situation->current_pieces;
  iVar12 = 0;
  iVar11 = 0;
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  iVar25 = 0;
  iVar9 = 0;
  lVar13 = 0;
  do {
    pUVar10 = pUVar10 + 0x10;
    lVar14 = 0;
    do {
      uVar6 = (uint)lVar14;
      if (uVar6 - 7 < 2) {
        if (pUVar10[lVar14] != '\0') {
          iVar9 = iVar9 + 1;
          if (lVar13 == 0) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar3 = iVar3 + 1;
          }
        }
      }
      else if ((uVar6 < 0xb) && ((0x660U >> (uVar6 & 0x1f) & 1) != 0)) {
        if (pUVar10[lVar14] != '\0') {
          iVar25 = iVar25 + 1;
          if (lVar13 == 0) {
            iVar11 = iVar11 + 1;
          }
          else {
            iVar12 = iVar12 + 1;
          }
        }
      }
      else {
        iVar5 = (iVar5 + 1) - (uint)(pUVar10[lVar14] == '\0');
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
    bVar15 = lVar13 == 0;
    lVar13 = lVar13 + 1;
  } while (bVar15);
  iVar5 = iVar25 * 3 + iVar9 * 6 + iVar5;
  iVar5 = (0x84 - iVar5) * iVar5;
  iVar25 = iVar5 / 0x42;
  AdvancedValue = (iVar25 * 4 + 2) / 0x42;
  situation->UseBook = 0x103d < iVar5;
  iVar5 = 0x42 - iVar25;
  piVar8 = PiecesValue[1][5] + 0xfe;
  pUVar10 = "";
  lVar13 = 0;
  do {
    if (*pUVar10 != '\0') {
      iVar9 = (*(int *)((long)KING_PAWN_ENDGAME_ATTACKING_VALUE + lVar13) * iVar5 +
              *(int *)((long)KING_PAWN_MIDGAME_ATTACKING_VALUE + lVar13) * iVar25) / 0x42;
      piVar8[-0x500] = iVar9;
      *(int *)((long)PiecesValue[0][0] + lVar13) = iVar9;
      iVar9 = (*(int *)((long)HORSE_ENDGAME_VALUE + lVar13) * iVar5 +
              *(int *)((long)HORSE_MIDGAME_VALUE + lVar13) * iVar25) / 0x42;
      piVar8[-0x200] = iVar9;
      *(int *)((long)PiecesValue[0][3] + lVar13) = iVar9;
      iVar9 = (*(int *)((long)ROOK_ENDGAME_VALUE + lVar13) * iVar5 +
              *(int *)((long)ROOK_MIDGAME_VALUE + lVar13) * iVar25) / 0x42;
      piVar8[-0x100] = iVar9;
      *(int *)((long)PiecesValue[0][4] + lVar13) = iVar9;
      iVar9 = (*(int *)((long)CANNON_ENDGAME_VALUE + lVar13) * iVar5 +
              *(int *)((long)CANNON_MIDGAME_VALUE + lVar13) * iVar25) / 0x42;
      *piVar8 = iVar9;
      *(int *)((long)PiecesValue[0][5] + lVar13) = iVar9;
      *(undefined4 *)((long)local_438 + lVar13) = *(undefined4 *)((long)PiecesValue[0][0] + lVar13);
      *(int *)((long)local_838 + lVar13) =
           (*(int *)((long)KING_PAWN_ENDGAME_ATTACKLESS_VALUE + lVar13) * iVar5 +
           *(int *)((long)KING_PAWN_MIDGAME_ATTACKLESS_VALUE + lVar13) * iVar25) / 0x42;
    }
    piVar8 = piVar8 + -1;
    lVar13 = lVar13 + 4;
    pUVar10 = pUVar10 + 1;
  } while (lVar13 != 0x400);
  CentralThreat[0xc] = 0x1e;
  CentralThreat[0xd] = 0;
  CentralThreat[0xe] = 0;
  CentralThreat[0xf] = 0;
  CentralThreat[8] = 0x28;
  CentralThreat[9] = 0x23;
  CentralThreat[10] = 0x1e;
  CentralThreat[0xb] = 0x1e;
  CentralThreat[4] = 0;
  CentralThreat[5] = 0;
  CentralThreat[6] = 0x32;
  CentralThreat[7] = 0x2d;
  CentralThreat[0] = 0;
  CentralThreat[1] = 0;
  CentralThreat[2] = 0;
  CentralThreat[3] = 0;
  uVar6 = iVar25 + 0x42;
  lVar13 = 0;
  do {
    auVar20 = *(undefined1 (*) [16])((long)HOLLOW_THREAT_VALUE + lVar13);
    iVar25 = auVar20._4_4_;
    auVar28._4_4_ = iVar25;
    auVar28._0_4_ = iVar25;
    auVar28._8_4_ = auVar20._12_4_;
    auVar28._12_4_ = auVar20._12_4_;
    uVar7 = auVar20._0_4_ * uVar6;
    uVar26 = (auVar20._8_8_ & 0xffffffff) * (ulong)uVar6;
    uVar29 = (auVar28._8_8_ & 0xffffffff) * (ulong)uVar6;
    iVar5 = (int)((ulong)uVar7 * 0x3e0f83e1 >> 0x20) - (-(uint)((int)uVar7 < 0) & 0x3e0f83e1);
    iVar25 = (int)((ulong)(iVar25 * uVar6) * 0x3e0f83e1 >> 0x20) -
             (-(uint)((int)(iVar25 * uVar6) < 0) & 0x3e0f83e1);
    iVar9 = (int)((uVar26 & 0xffffffff) * 0x3e0f83e1 >> 0x20) -
            (-(uint)((int)uVar26 < 0) & 0x3e0f83e1);
    iVar27 = (int)((uVar29 & 0xffffffff) * 0x3e0f83e1 >> 0x20) -
             (-(uint)((int)uVar29 < 0) & 0x3e0f83e1);
    *(int *)((long)HollowThreat + lVar13) = (iVar5 >> 5) - (iVar5 >> 0x1f);
    *(int *)((long)HollowThreat + lVar13 + 4) = (iVar25 >> 5) - (iVar25 >> 0x1f);
    *(int *)((long)HollowThreat + lVar13 + 8) = (iVar9 >> 5) - (iVar9 >> 0x1f);
    *(int *)((long)HollowThreat + lVar13 + 0xc) = (iVar27 >> 5) - (iVar27 >> 0x1f);
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  uVar1 = *(undefined4 *)(situation->current_pieces + 0x15);
  cVar16 = -('\0' < (char)uVar1);
  cVar21 = -('\0' < (char)((uint)uVar1 >> 8));
  cVar22 = -('\0' < (char)((uint)uVar1 >> 0x10));
  cVar24 = -('\0' < (char)((uint)uVar1 >> 0x18));
  uVar23 = CONCAT11(cVar24,cVar24);
  uVar1 = CONCAT31(CONCAT21(uVar23,cVar22),cVar22);
  uVar2 = CONCAT51(CONCAT41(uVar1,cVar21),cVar21);
  auVar19._0_2_ = CONCAT11(cVar16,cVar16);
  uVar26 = CONCAT62(uVar2,auVar19._0_2_);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar26;
  auVar18._12_2_ = uVar23;
  auVar18._14_2_ = uVar23;
  uVar23 = (undefined2)uVar1;
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar26;
  auVar17._10_2_ = uVar23;
  auVar20._10_6_ = auVar17._10_6_;
  auVar20._8_2_ = uVar23;
  auVar20._0_8_ = uVar26;
  uVar23 = (undefined2)uVar2;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = uVar23;
  auVar19._4_2_ = uVar23;
  auVar19._2_2_ = auVar19._0_2_;
  auVar19 = auVar19 & _DAT_0010f6c0;
  uVar6 = auVar19._12_4_ * 2 + auVar19._4_4_ * 2 + auVar19._8_4_ * 2 + auVar19._0_4_ * 2;
  lVar13 = 0;
  do {
    uVar6 = uVar6 + ('\0' < (char)situation->current_pieces[lVar13 + 0x19]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 7);
  auVar20 = psadbw(ZEXT416(CONCAT22((ushort)((uint)*(undefined4 *)(situation->current_pieces + 0x25)
                                            >> 0x16),
                                    (ushort)*(undefined4 *)(situation->current_pieces + 0x25) >> 6)
                           & (uint)DAT_0010f6d0),(undefined1  [16])0x0);
  uVar7 = auVar20._0_4_;
  lVar13 = 0;
  do {
    uVar7 = uVar7 + (situation->current_pieces[lVar13 + 0x29] >> 7);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 7);
  iVar11 = iVar11 + iVar4 * 2;
  iVar12 = iVar12 + iVar3 * 2;
  if (iVar11 - iVar12 == 0 || iVar11 < iVar12) {
    uVar7 = uVar7 + (iVar12 - iVar11) * 2;
  }
  else {
    uVar6 = uVar6 + (iVar11 - iVar12) * 2;
  }
  if (7 < (int)uVar6) {
    uVar6 = 8;
  }
  if (7 < (int)uVar7) {
    uVar7 = 8;
  }
  BlackAdvisorLeakage = uVar6 * 10;
  RedAdvisorLeakage = uVar7 * 10;
  lVar13 = 0x3f8;
  pUVar10 = "";
  lVar14 = 0;
  do {
    if (*pUVar10 != '\0') {
      iVar5 = *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar14) * uVar7;
      iVar11 = *(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar14) * (8 - uVar7);
      iVar12 = iVar11 + iVar5;
      iVar11 = iVar11 + iVar5 + 7;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      *(int *)((long)PiecesValue[0][2] + lVar14) = iVar11 >> 3;
      *(int *)((long)PiecesValue[0][1] + lVar14) = iVar11 >> 3;
      iVar5 = *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar13) * uVar6;
      iVar11 = *(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar13) * (8 - uVar6);
      iVar12 = iVar11 + iVar5;
      iVar11 = iVar11 + iVar5 + 7;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      *(int *)((long)PiecesValue[1][2] + lVar14) = iVar11 >> 3;
      *(int *)((long)PiecesValue[1][1] + lVar14) = iVar11 >> 3;
      iVar5 = *(int *)((long)local_438 + lVar14) * uVar6;
      iVar11 = *(int *)((long)local_838 + lVar14) * (8 - uVar6);
      iVar12 = iVar11 + iVar5;
      iVar11 = iVar11 + iVar5 + 7;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      *(int *)((long)PiecesValue[0][6] + lVar14) = iVar11 >> 3;
      iVar5 = *(int *)((long)local_438 + lVar13) * uVar7;
      iVar11 = *(int *)((long)local_838 + lVar13) * (8 - uVar7);
      iVar12 = iVar11 + iVar5;
      iVar11 = iVar11 + iVar5 + 7;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      *(int *)((long)PiecesValue[1][6] + lVar14) = iVar11 >> 3;
    }
    lVar13 = lVar13 + -4;
    lVar14 = lVar14 + 4;
    pUVar10 = pUVar10 + 1;
  } while (lVar14 != 0x400);
  lVar13 = 0;
  do {
    auVar20 = *(undefined1 (*) [16])((long)BOTTOM_THREAT + lVar13);
    iVar11 = auVar20._0_4_ * uVar7;
    iVar5 = (int)((auVar20._8_8_ & 0xffffffff) * (ulong)uVar7);
    iVar12 = auVar20._4_4_;
    auVar30._4_4_ = iVar12;
    auVar30._0_4_ = iVar12;
    auVar30._8_4_ = auVar20._12_4_;
    auVar30._12_4_ = auVar20._12_4_;
    iVar3 = (int)((auVar30._8_8_ & 0xffffffff) * (ulong)uVar7);
    *(int *)((long)RedBottomThreat + lVar13) = (int)(((uint)(iVar11 >> 0x1f) >> 0x1d) + iVar11) >> 3
    ;
    *(int *)((long)RedBottomThreat + lVar13 + 4) =
         (int)(((uint)((int)(iVar12 * uVar7) >> 0x1f) >> 0x1d) + iVar12 * uVar7) >> 3;
    *(int *)((long)RedBottomThreat + lVar13 + 8) =
         (int)(((uint)(iVar5 >> 0x1f) >> 0x1d) + iVar5) >> 3;
    *(int *)((long)RedBottomThreat + lVar13 + 0xc) =
         (int)(((uint)(iVar3 >> 0x1f) >> 0x1d) + iVar3) >> 3;
    iVar11 = auVar20._0_4_ * uVar6;
    iVar5 = (int)((auVar20._8_8_ & 0xffffffff) * (ulong)uVar6);
    iVar3 = (int)((auVar30._8_8_ & 0xffffffff) * (ulong)uVar6);
    *(int *)((long)BlackBottomThreat + lVar13) =
         (int)(((uint)(iVar11 >> 0x1f) >> 0x1d) + iVar11) >> 3;
    *(int *)((long)BlackBottomThreat + lVar13 + 4) =
         (int)(((uint)((int)(iVar12 * uVar6) >> 0x1f) >> 0x1d) + iVar12 * uVar6) >> 3;
    *(int *)((long)BlackBottomThreat + lVar13 + 8) =
         (int)(((uint)(iVar5 >> 0x1f) >> 0x1d) + iVar5) >> 3;
    *(int *)((long)BlackBottomThreat + lVar13 + 0xc) =
         (int)(((uint)(iVar3 >> 0x1f) >> 0x1d) + iVar3) >> 3;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  iVar11 = (8 - uVar7) * 10;
  lVar13 = 0;
  do {
    if ((ulong)situation->current_pieces[lVar13 + 0x10] != 0) {
      iVar11 = iVar11 + PiecesValue[0][PIECE_NUM_TO_TYPE[lVar13 + 0x10]]
                        [situation->current_pieces[lVar13 + 0x10]];
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  iVar12 = (8 - uVar6) * 10;
  lVar13 = 0;
  do {
    if ((ulong)situation->current_pieces[lVar13 + 0x20] != 0) {
      iVar12 = iVar12 + *(int *)((long)PIECE_NUM_TO_TYPE[lVar13 + 0x20] * 0x400 + 0x3455d0 +
                                (ulong)situation->current_pieces[lVar13 + 0x20] * 4);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  situation->value[0] = iVar11;
  situation->value[1] = iVar12;
  return;
}

Assistant:

void PreEvaluate(Situation &situation)
{
    int side_tag;                             //用于标志行走方
    int black_value = 0, red_value = 0;       //记录价值
    int red_attacks = 0, black_attacks = 0;   //双方威胁值
    int red_simple_value, black_simple_value; //双方轻子价值
    int midgame_value = 0;
    int attacking_pawn_value[256] = {0}, attackless_pawn_value[256] = {0};

    //首先判断局势处于开中局还是残局阶段，方法是计算各种棋子的数量，按照车=6、马炮=3、其它=1相加。
    //统计三类棋子数量
    int rook_nums = 0, horse_cannon_nums = 0, others_nums = 0;
    int red_rook_nums = 0, black_rook_nums = 0, red_horse_cannon_nums = 0, black_horsecannon_nums = 0;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        for (int i = 0; i < 16; i++)
        {
            if (i == 7 || i == 8) //车
            {
                if (situation.current_pieces[side_tag + i])
                {
                    rook_nums++;
                    if (r == 0)
                        red_rook_nums++;
                    else
                        black_rook_nums++;
                }
            }
            else if (i == 5 || i == 6 || i == 9 || i == 10) //马炮
            {
                if (situation.current_pieces[side_tag + i])
                {
                    horse_cannon_nums++;
                    if (r == 0)
                        red_horse_cannon_nums++;
                    else
                        black_horsecannon_nums++;
                }
            }
            else
            {
                if (situation.current_pieces[side_tag + i])
                    others_nums++;
            }
        }
    }
    midgame_value += rook_nums * ROOK_VALUE;
    midgame_value += horse_cannon_nums * HORSE_CANNON_VALUE;
    midgame_value += others_nums * OTHER_VALUE;
    //使用二次函数，子力很少时才认为接近残局
    midgame_value = (2 * TOTAL_MIDGAME_VALUE - midgame_value) * midgame_value / TOTAL_MIDGAME_VALUE;
    AdvancedValue = (TOTAL_AdvancedValue * midgame_value + TOTAL_AdvancedValue / 2) / TOTAL_MIDGAME_VALUE;
    situation.UseBook = midgame_value > 62;
    //计算将车马炮的价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][0][i] = PiecesValue[BLACK][0][254 - i] = ((KING_PAWN_MIDGAME_ATTACKING_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKING_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][3][i] = PiecesValue[BLACK][3][254 - i] = ((HORSE_MIDGAME_VALUE[i] * midgame_value + HORSE_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][4][i] = PiecesValue[BLACK][4][254 - i] = ((ROOK_MIDGAME_VALUE[i] * midgame_value + ROOK_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][5][i] = PiecesValue[BLACK][5][254 - i] = ((CANNON_MIDGAME_VALUE[i] * midgame_value + CANNON_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            attacking_pawn_value[i] = PiecesValue[RED][0][i];
            attackless_pawn_value[i] = ((KING_PAWN_MIDGAME_ATTACKLESS_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKLESS_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
        }
    }

    //计算空头炮和中炮威胁值
    for (int i = 0; i < 16; i++)
    {
        HollowThreat[i] = HOLLOW_THREAT_VALUE[i] * (midgame_value + TOTAL_MIDGAME_VALUE) / (TOTAL_MIDGAME_VALUE * 2);
        CentralThreat[i] = CENTRAL_THREAT_VALUE[i];
    }

    //然后判断各方是否处于进攻状态，方法是计算各种过河棋子的数量，按照车马2炮兵1相加。
    for (int i = 16 + 5; i <= 16 + 8; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks += 2;
    }
    for (int i = 16 + 9; i <= 16 + 15; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks++;
    }
    for (int i = 32 + 5; i <= 32 + 8; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks += 2;
    }
    for (int i = 32 + 9; i <= 32 + 15; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks++;
    }

    //如果本方轻子数比对方多，那么每多一个轻子(车算2个轻子)威胁值加2。威胁值最多不超过8。
    red_simple_value = red_rook_nums * 2 + red_horse_cannon_nums;
    black_simple_value = black_rook_nums * 2 + black_horsecannon_nums;
    if (red_simple_value > black_simple_value)
    {
        red_attacks += (red_simple_value - black_simple_value) * 2;
    }
    else
    {
        black_attacks += (black_simple_value - red_simple_value) * 2;
    }
    red_attacks = std::min(red_attacks, TOTAL_ATTACK_VALUE);
    black_attacks = std::min(black_attacks, TOTAL_ATTACK_VALUE);

    //计算士的缺值
    BlackAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * red_attacks / TOTAL_ATTACK_VALUE;
    RedAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * black_attacks / TOTAL_ATTACK_VALUE;

    //计算士象兵价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][1][i] = PiecesValue[RED][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[i] * black_attacks +
                                                                THREATLESS_ADVISOR_BISHOP_VALUE[i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                                               TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][1][i] = PiecesValue[BLACK][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[254 - i] * red_attacks +
                                                                    THREATLESS_ADVISOR_BISHOP_VALUE[254 - i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                                                   TOTAL_ATTACK_VALUE);
            PiecesValue[RED][6][i] = ((attacking_pawn_value[i] * red_attacks +
                                       attackless_pawn_value[i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                      TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][6][i] = ((attacking_pawn_value[254 - i] * black_attacks +
                                         attackless_pawn_value[254 - i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                        TOTAL_ATTACK_VALUE);
        }
    }

    //计算沉底炮威胁值
    for (int i = 0; i < 16; i++)
    {
        RedBottomThreat[i] = BOTTOM_THREAT[i] * black_attacks / TOTAL_ATTACK_VALUE;
        BlackBottomThreat[i] = BOTTOM_THREAT[i] * red_attacks / TOTAL_ATTACK_VALUE;
    }

    // 调整不受威胁方少掉的仕(士)相(象)分值
    red_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - black_attacks) / TOTAL_ATTACK_VALUE;
    black_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - red_attacks) / TOTAL_ATTACK_VALUE;
    // 最后重新计算子力位置分
    for (int i = 16; i < 32; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            red_value += PiecesValue[RED][PIECE_NUM_TO_TYPE[i]][pos];
    }
    for (int i = 32; i < 48; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            black_value += PiecesValue[BLACK][PIECE_NUM_TO_TYPE[i]][pos];
    }

    situation.value[RED] = red_value;
    situation.value[BLACK] = black_value;
}